

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::SectionInfo::SectionInfo(SectionInfo *this,SourceLineInfo *_lineInfo,string *_name)

{
  pointer pcVar1;
  size_t sVar2;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  sVar2 = _lineInfo->line;
  (this->lineInfo).file = _lineInfo->file;
  (this->lineInfo).line = sVar2;
  return;
}

Assistant:

SectionInfo::SectionInfo
    (SourceLineInfo const& _lineInfo,
        std::string const& _name)
        : name(_name),
        lineInfo(_lineInfo) {
    }